

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_type.c
# Opt level: O2

apx_dataType_t * apx_dataType_new(char *name,int32_t line_number)

{
  apx_error_t aVar1;
  apx_dataType_t *self;
  
  self = (apx_dataType_t *)malloc(0x28);
  if (self != (apx_dataType_t *)0x0) {
    aVar1 = apx_dataType_create(self,name,line_number);
    if (aVar1 == 0) {
      return self;
    }
    free(self);
  }
  return (apx_dataType_t *)0x0;
}

Assistant:

apx_dataType_t* apx_dataType_new(const char* name, int32_t line_number)
{
   apx_dataType_t* self = (apx_dataType_t*)malloc(sizeof(apx_dataType_t));
   if (self != 0)
   {
      apx_error_t result = apx_dataType_create(self, name, line_number);
      if (result != APX_NO_ERROR)
      {
         free(self);
         self = 0;
      }
   }
   return self;
}